

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowererMDArch.cpp
# Opt level: O2

void __thiscall LowererMDArch::FinalLower(LowererMDArch *this)

{
  OpCode OVar1;
  int iVar2;
  Lowerer *this_00;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  IntConstOpnd *newSrc;
  BranchInstr *pBVar7;
  Instr *pIVar8;
  Func *func;
  Instr *pIVar9;
  Instr *this_01;
  
  pIVar9 = this->m_func->m_headInstr;
  if (pIVar9 == (Instr *)0x0) {
    pIVar9 = (Instr *)0x0;
  }
  else {
    pIVar9 = pIVar9->m_prev;
  }
  pIVar8 = this->m_func->m_tailInstr;
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
LAB_005d1721:
  do {
    while( true ) {
      this_01 = pIVar8;
      if (this_01 == pIVar9) {
        return;
      }
      pIVar8 = this_01->m_prev;
      OVar1 = this_01->m_opcode;
      if (0xf < OVar1 - 0x3e6) break;
      if (this_01->m_src2 != (Opnd *)0x0) {
        IR::Instr::SwapOpnds(this_01);
LAB_005d1752:
        IR::Instr::FreeSrc2(this_01);
      }
    }
    if (OVar1 == LOCKCMPXCHG8B) {
LAB_005d179a:
      IR::Instr::FreeDst(this_01);
      goto LAB_005d1752;
    }
    if (OVar1 != Leave) {
      if (OVar1 == LdArgSize) {
        BVar5 = Func::HasTry(this->m_func);
        if (BVar5 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                             ,0xd17,"(this->m_func->HasTry())","this->m_func->HasTry()");
          if (!bVar4) goto LAB_005d1930;
          *puVar6 = 0;
        }
        this_01->m_opcode = MOV;
        func = this->m_func;
        iVar2 = func->m_argsSize;
      }
      else {
        if (OVar1 != LdSpillSize) {
          if (OVar1 == CMPXCHG8B) goto LAB_005d179a;
          if (OVar1 == Ret) {
            IR::Instr::Remove(this_01);
          }
          else {
            bVar4 = IR::Instr::HasLazyBailOut(this_01);
            if (bVar4) {
              Func::SetHasLazyBailOut(this->m_func);
            }
          }
          goto LAB_005d1721;
        }
        BVar5 = Func::HasTry(this->m_func);
        if (BVar5 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                             ,0xd1f,"(this->m_func->HasTry())","this->m_func->HasTry()");
          if (!bVar4) goto LAB_005d1930;
          *puVar6 = 0;
        }
        this_01->m_opcode = MOV;
        func = this->m_func;
        iVar2 = func->m_spillSize;
      }
      newSrc = IR::IntConstOpnd::New((long)iVar2,TyUint32,func,false);
      IR::Instr::SetSrc1(this_01,&newSrc->super_Opnd);
      LowererMD::Legalize<false>(this_01,false);
      goto LAB_005d1721;
    }
    bVar4 = Func::DoOptimizeTry(this->m_func);
    if (bVar4) {
      bVar4 = Func::IsLoopBodyInTry(this->m_func);
      if (bVar4) goto LAB_005d18b8;
    }
    else {
LAB_005d18b8:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                         ,0xd27,
                         "(this->m_func->DoOptimizeTry() && !this->m_func->IsLoopBodyInTry())",
                         "this->m_func->DoOptimizeTry() && !this->m_func->IsLoopBodyInTry()");
      if (!bVar4) {
LAB_005d1930:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
    this_00 = this->lowererMD->m_lowerer;
    pBVar7 = IR::Instr::AsBranchInstr(this_01);
    pIVar8 = Lowerer::LowerLeave(this_00,this_01,pBVar7->m_branchTarget,true,false);
  } while( true );
}

Assistant:

void
LowererMDArch::FinalLower()
{
    IR::IntConstOpnd *intOpnd;

    FOREACH_INSTR_BACKWARD_EDITING_IN_RANGE(instr, instrPrev, this->m_func->m_tailInstr, this->m_func->m_headInstr)
    {
        switch (instr->m_opcode)
        {
        case Js::OpCode::Ret:
            instr->Remove();
            break;
        case Js::OpCode::LdArgSize:
            Assert(this->m_func->HasTry());
            instr->m_opcode = Js::OpCode::MOV;
            intOpnd = IR::IntConstOpnd::New(this->m_func->GetArgsSize(), TyUint32, this->m_func);
            instr->SetSrc1(intOpnd);
            LowererMD::Legalize(instr);
            break;

        case Js::OpCode::LdSpillSize:
            Assert(this->m_func->HasTry());
            instr->m_opcode = Js::OpCode::MOV;
            intOpnd = IR::IntConstOpnd::New(this->m_func->GetSpillSize(), TyUint32, this->m_func);
            instr->SetSrc1(intOpnd);
            LowererMD::Legalize(instr);
            break;

        case Js::OpCode::Leave:
            Assert(this->m_func->DoOptimizeTry() && !this->m_func->IsLoopBodyInTry());
            instrPrev = this->lowererMD->m_lowerer->LowerLeave(instr, instr->AsBranchInstr()->GetTarget(), true /*fromFinalLower*/);
            break;

        case Js::OpCode::CMOVA:
        case Js::OpCode::CMOVAE:
        case Js::OpCode::CMOVB:
        case Js::OpCode::CMOVBE:
        case Js::OpCode::CMOVE:
        case Js::OpCode::CMOVG:
        case Js::OpCode::CMOVGE:
        case Js::OpCode::CMOVL:
        case Js::OpCode::CMOVLE:
        case Js::OpCode::CMOVNE:
        case Js::OpCode::CMOVNO:
        case Js::OpCode::CMOVNP:
        case Js::OpCode::CMOVNS:
        case Js::OpCode::CMOVO:
        case Js::OpCode::CMOVP:
        case Js::OpCode::CMOVS:
            // Get rid of fake src1.
            if (instr->GetSrc2())
            {
                // CMOV inserted before regalloc have a dummy src1 to simulate the fact that
                // CMOV is not a definite def of the dst.
                instr->SwapOpnds();
                instr->FreeSrc2();
            }
            break;
        case Js::OpCode::LOCKCMPXCHG8B:
        case Js::OpCode::CMPXCHG8B:
            // Get rid of the deps and srcs
            instr->FreeDst();
            instr->FreeSrc2();
            break;
        default:
            if (instr->HasLazyBailOut())
            {
                // Since Lowerer and Peeps might have removed instructions with lazy bailout
                // if we attach them to helper calls, FinalLower is the first phase that
                // we can know if the function has any lazy bailouts at all.
                this->m_func->SetHasLazyBailOut();
            }

            break;
        }
    } NEXT_INSTR_BACKWARD_EDITING_IN_RANGE;
}